

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

EC_KEY * ecdh_gerenate_key(EC_GROUP *group)

{
  int iVar1;
  EC_KEY *key;
  EC_GROUP *group_local;
  
  group_local = (EC_GROUP *)EC_KEY_new();
  if (group_local == (EC_GROUP *)0x0) {
    group_local = (EC_GROUP *)0x0;
  }
  else {
    iVar1 = EC_KEY_set_group((EC_KEY *)group_local,(EC_GROUP *)group);
    if ((iVar1 == 0) || (iVar1 = EC_KEY_generate_key((EC_KEY *)group_local), iVar1 == 0)) {
      EC_KEY_free((EC_KEY *)group_local);
      group_local = (EC_GROUP *)0x0;
    }
  }
  return (EC_KEY *)group_local;
}

Assistant:

static EC_KEY *ecdh_gerenate_key(EC_GROUP *group)
{
    EC_KEY *key;

    if ((key = EC_KEY_new()) == NULL)
        return NULL;
    if (!EC_KEY_set_group(key, group) || !EC_KEY_generate_key(key)) {
        EC_KEY_free(key);
        return NULL;
    }

    return key;
}